

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O3

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  
  iVar1 = ParamDict::get(pd,0,-0xe9);
  this->w = iVar1;
  iVar1 = ParamDict::get(pd,1,-0xe9);
  this->h = iVar1;
  iVar1 = ParamDict::get(pd,0xb,-0xe9);
  this->d = iVar1;
  iVar1 = ParamDict::get(pd,2,-0xe9);
  this->c = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->permute = iVar1;
  auVar3._0_4_ = -(uint)(this->w == -0xe9);
  auVar3._4_4_ = -(uint)(this->h == -0xe9);
  auVar3._8_4_ = -(uint)(this->d == -0xe9);
  auVar3._12_4_ = -(uint)(this->c == -0xe9);
  uVar2 = movmskps(iVar1,auVar3);
  iVar1 = 4 - (uint)(((byte)uVar2 & 4) >> 2);
  if ((uVar2 & 8) != 0) {
    iVar1 = 2;
  }
  if ((uVar2 & 2) != 0) {
    iVar1 = 1;
  }
  if ((uVar2 & 1) != 0) {
    iVar1 = 0;
  }
  this->ndim = iVar1;
  return 0;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    d = pd.get(11, -233);
    c = pd.get(2, -233);
    permute = pd.get(3, 0);

    ndim = 4;
    if (d == -233)
        ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    return 0;
}